

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O0

VRDatumPtr MinVR::CreateVRDatumStringArray(void *pData)

{
  VRDatumPtrRC *extraout_RDX;
  VRDatum_conflict *in_RDI;
  VRDatumPtr VVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  VRDatumStringArray *obj;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  VRDatum *in_stack_ffffffffffffffc8;
  VRDatumPtr *in_stack_ffffffffffffffd0;
  VRStringArray *in_stack_ffffffffffffffd8;
  VRDatumStringArray *in_stack_ffffffffffffffe0;
  VRDatum_conflict *__x;
  
  __x = in_RDI;
  operator_new(0x68);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(unaff_retaddr,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__x);
  VRDatumStringArray::VRDatumStringArray(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(CONCAT44(in_stack_ffffffffffffffc4,uVar2) & 0xffffffff00ffffff));
  VRDatumPtr::VRDatumPtr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  VVar1.reference = extraout_RDX;
  VVar1.pData = in_RDI;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumStringArray(void *pData) {
  VRDatumStringArray *obj =
    new VRDatumStringArray(*static_cast<VRStringArray *>(pData));
  return VRDatumPtr(obj);
}